

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interrupt_signal.cpp
# Opt level: O2

int main(void)

{
  _Any_data local_468;
  code *local_458;
  code *local_450;
  Signal signal;
  Loop loop;
  
  signal.super_Handle<uv_signal_s>.handle_.data = &signal;
  signal.super_Handle<uv_signal_s>.closeHandler_.super__Function_base._M_functor._M_unused._M_object
       = (void *)0x0;
  signal.super_Handle<uv_signal_s>.closeHandler_.super__Function_base._M_functor._8_8_ = 0;
  signal.super_Handle<uv_signal_s>.closeHandler_._M_invoker =
       std::
       _Function_handler<void_(),_uv::Handle<uv_signal_s>::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/../include/uv++/Handle.hpp:28:41)>
       ::_M_invoke;
  signal.super_Handle<uv_signal_s>.closeHandler_.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_uv::Handle<uv_signal_s>::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/../include/uv++/Handle.hpp:28:41)>
       ::_M_manager;
  signal.startHandler_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  signal.startHandler_.super__Function_base._M_functor._8_8_ = 0;
  signal.startHandler_._M_invoker =
       std::
       _Function_handler<void_(int),_uv::Signal::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/../include/uv++/Signal.hpp:28:57)>
       ::_M_invoke;
  signal.startHandler_.super__Function_base._M_manager =
       std::
       _Function_handler<void_(int),_uv::Signal::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/../include/uv++/Signal.hpp:28:57)>
       ::_M_manager;
  uv::Loop::init(&loop,(EVP_PKEY_CTX *)0x0);
  uv::Signal::init(&signal,(EVP_PKEY_CTX *)&loop);
  local_468._M_unused._M_object = (void *)0x0;
  local_468._8_8_ = 0;
  local_450 = std::
              _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/interrupt_signal.cpp:13:16)>
              ::_M_invoke;
  local_458 = std::
              _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/interrupt_signal.cpp:13:16)>
              ::_M_manager;
  uv::Signal::start(&signal,(function<void_(int)> *)&local_468,2);
  std::_Function_base::~_Function_base((_Function_base *)&local_468);
  uv::Loop::run(&loop);
  uv::Signal::~Signal(&signal);
  uv::Loop::~Loop(&loop);
  return 0;
}

Assistant:

int main()
{
	uv::Loop loop;
	uv::Signal signal;

	try {
		loop.init();
		signal.init(loop);

		signal.start([](int signum) {
			std::cout << "Ctrl+C中断,信号量值为:" << signum << std::endl;
		}, SIGINT);

		loop.run();
	}
	catch (const uv::Exception &ex) {
		std::cout << ex.what() << std::endl;
	}
}